

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

BPMNode * bpmnode_create(BPMLists *lists,int weight,uint index,BPMNode *tail)

{
  uint uVar1;
  BPMNode *pBVar2;
  BPMNode *node;
  BPMNode *result;
  uint i;
  BPMNode *tail_local;
  uint index_local;
  int weight_local;
  BPMLists *lists_local;
  
  if (lists->numfree <= lists->nextfree) {
    for (i = 0; i != lists->memsize; i = i + 1) {
      lists->memory[i].in_use = 0;
    }
    for (i = 0; i != lists->listsize; i = i + 1) {
      for (node = lists->chains0[i]; node != (BPMNode *)0x0; node = node->tail) {
        node->in_use = 1;
      }
      for (node = lists->chains1[i]; node != (BPMNode *)0x0; node = node->tail) {
        node->in_use = 1;
      }
    }
    lists->numfree = 0;
    for (i = 0; i != lists->memsize; i = i + 1) {
      if (lists->memory[i].in_use == 0) {
        uVar1 = lists->numfree;
        lists->numfree = uVar1 + 1;
        lists->freelist[uVar1] = lists->memory + i;
      }
    }
    lists->nextfree = 0;
  }
  uVar1 = lists->nextfree;
  lists->nextfree = uVar1 + 1;
  pBVar2 = lists->freelist[uVar1];
  pBVar2->weight = weight;
  pBVar2->index = index;
  pBVar2->tail = tail;
  return pBVar2;
}

Assistant:

static BPMNode* bpmnode_create(BPMLists* lists, int weight, unsigned index, BPMNode* tail)
{
	unsigned i;
	BPMNode* result;

	/*memory full, so garbage collect*/
	if (lists->nextfree >= lists->numfree)
	{
		/*mark only those that are in use*/
		for (i = 0; i != lists->memsize; ++i) lists->memory[i].in_use = 0;
		for (i = 0; i != lists->listsize; ++i)
		{
			BPMNode* node;
			for (node = lists->chains0[i]; node != 0; node = node->tail) node->in_use = 1;
			for (node = lists->chains1[i]; node != 0; node = node->tail) node->in_use = 1;
		}
		/*collect those that are free*/
		lists->numfree = 0;
		for (i = 0; i != lists->memsize; ++i)
		{
			if (!lists->memory[i].in_use) lists->freelist[lists->numfree++] = &lists->memory[i];
		}
		lists->nextfree = 0;
	}

	result = lists->freelist[lists->nextfree++];
	result->weight = weight;
	result->index = index;
	result->tail = tail;
	return result;
}